

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O2

void __thiscall
CheckedSharedMutexTest_RecurseTryLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_RecurseTryLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  ReturnSentinel gtest_sentinel;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  char *pcVar5;
  long local_f8 [2];
  DeathTest *gtest_dt;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  TypeParam mtx;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  local_f8[0] = 0;
  local_f8[1] = 0;
  pcVar5 = (char *)0x0;
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
              ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
  }
  std::__cxx11::string::~string((string *)&local_108);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_shared()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,300,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    pDVar1 = gtest_dt;
    if (!bVar3) goto LAB_00189694;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_108,6);
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])();
        bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_108,iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 != '\0') goto LAB_00189674;
        iVar4 = 3;
        bVar3 = false;
      }
      else {
        if (iVar4 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock_shared
                      ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_00189674:
        iVar4 = 0;
        bVar3 = true;
      }
      (*pDVar1->_vptr_DeathTest[1])(pDVar1);
      if ((!bVar3) && (iVar4 != 0)) {
        if (iVar4 != 3) goto LAB_00189718;
        goto LAB_00189694;
      }
    }
  }
  else {
LAB_00189694:
    testing::Message::Message((Message *)&local_108);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,300,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
              ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
  }
  std::__cxx11::string::~string((string *)&local_108);
LAB_00189718:
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, RecurseTryLockShared) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.try_lock_shared());
  ASSERT_NO_THROW(mtx.unlock_shared());
}